

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_mem.c
# Opt level: O3

int amqp_bytes_equal(amqp_bytes_t r,amqp_bytes_t l)

{
  int iVar1;
  
  if (r.len == l.len) {
    if (r.bytes == l.bytes) {
      return 1;
    }
    iVar1 = bcmp(r.bytes,l.bytes,r.len);
    if (iVar1 == 0) {
      return 1;
    }
  }
  return 0;
}

Assistant:

int amqp_bytes_equal(amqp_bytes_t r, amqp_bytes_t l) {
  if (r.len == l.len &&
      (r.bytes == l.bytes || 0 == memcmp(r.bytes, l.bytes, r.len))) {
    return 1;
  }
  return 0;
}